

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall despot::Parser::ParseDiscountTag(Parser *this,TiXmlHandle *xml_handle)

{
  int iVar1;
  undefined4 extraout_var;
  TiXmlElement *this_00;
  char *__s;
  log_ostream *plVar2;
  ostream *poVar3;
  string discount_str;
  TiXmlHandle local_a0 [2];
  undefined1 local_90 [16];
  TiXmlHandle local_80;
  string local_78;
  string local_58;
  double local_38;
  undefined8 uStack_30;
  undefined4 extraout_var_00;
  
  util::tinyxml::TiXmlHandle::FirstChild(&local_80,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild(local_a0,(char *)&local_80);
  if (local_a0[0].node != (TiXmlNode *)0x0) {
    iVar1 = (*((local_a0[0].node)->super_TiXmlBase)._vptr_TiXmlBase[0xb])();
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*((local_a0[0].node)->super_TiXmlBase)._vptr_TiXmlBase[0xb])();
      this_00 = (TiXmlElement *)CONCAT44(extraout_var_00,iVar1);
      goto LAB_0014b8e0;
    }
  }
  this_00 = (TiXmlElement *)0x0;
LAB_0014b8e0:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Cannot find Discount tag","")
  ;
  Ensure(this,this_00 != (TiXmlElement *)0x0,&local_58,(TiXmlBase *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  __s = util::tinyxml::TiXmlElement::GetText(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,__s,(allocator<char> *)&local_80);
  DAT_00192dc8 = atof((char *)local_a0[0].node);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar2 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>(&plVar2->super_ostream,"Discount = ",0xb);
      poVar3 = std::ostream::_M_insert<double>(DAT_00192dc8);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  local_38 = DAT_00192dc8;
  uStack_30 = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Discount factor must be in (0, 1).","");
  Ensure(this,(bool)(-(local_38 < 1.0) & -(0.0 < local_38) & 1),&local_78,(TiXmlBase *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_a0[0].node != (TiXmlNode *)local_90) {
    operator_delete(local_a0[0].node,local_90._0_8_ + 1);
  }
  return;
}

Assistant:

void Parser::ParseDiscountTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_Discount = xml_handle.FirstChild("pomdpx").FirstChild(
		"Discount").ToElement();

	Ensure(e_Discount != NULL, "Cannot find Discount tag");

	string discount_str = e_Discount->GetText();
	Globals::config.discount = atof(discount_str.c_str());
	logi << "Discount = " << Globals::config.discount << endl;

	Ensure(Globals::config.discount < 1.0 && Globals::config.discount > 0,
		"Discount factor must be in (0, 1).", e_Discount);
}